

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

void __thiscall StructTable::print(StructTable *this)

{
  size_t sVar1;
  ostream *this_00;
  long *plVar2;
  long lVar3;
  Symbol *pSVar4;
  char *pcVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n*****************************",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"STRUCTS",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****************************",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Lexeme",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Scope",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Scope Lexeme",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****************************",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  lVar3 = 0;
  do {
    for (pSVar4 = (this->super_SymbolTable).block[lVar3]; pSVar4 != (Symbol *)0x0;
        pSVar4 = pSVar4->nextSymbol) {
      pcVar5 = (this->super_SymbolTable).lexemeArray;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1280c0);
      }
      else {
        pcVar5 = pcVar5 + pSVar4->lexemeIndex;
        sVar1 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pSVar4->scope);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"\t",1);
      pcVar5 = pSVar4->lexemeScope;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
      }
      else {
        sVar1 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar5,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"\t",1);
      plVar2 = (long *)std::ostream::operator<<(this_00,pSVar4[1].lexemeIndex);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x65);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****************************",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##########################################################",0x3a
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void StructTable::print() {
    cout << "\n*****************************" << endl;
    cout << "\t\t" << "STRUCTS" << endl;
    cout << "*****************************" << endl;
    cout << "Lexeme" << "\t" << "Scope" << "\t" << "Scope Lexeme" << "\t" << "Size" << endl;
    cout << "*****************************" << endl;

    for (int i = 0; i < TABLE_SIZE; i++) {
        for (StructSymbol *symbol = (StructSymbol *) block[i];
             symbol != NULL; symbol = (StructSymbol *) symbol->getNextSymbol()) {
            cout << lexemeArray + symbol->getLexemeIndex() << "\t" << symbol->getScope() << "\t"
                 << symbol->getLexemeScope() << "\t" << symbol->getSize() << endl;
        }
    }
    cout << "*****************************" << endl;
    cout << "##########################################################" << endl;
}